

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo.cpp
# Opt level: O1

void __thiscall
DSBarInfo::DrawGraphic
          (DSBarInfo *this,FTexture *texture,SBarInfoCoordinate x,SBarInfoCoordinate y,int xOffset,
          int yOffset,double Alpha,bool fullScreenOffsets,bool translate,bool dim,int offsetflags,
          bool alphaMap,int forceWidth)

{
  double dVar1;
  bool bVar2;
  SBarInfo *pSVar3;
  double y_00;
  FRemapTable *pFVar4;
  int iVar5;
  uint uVar6;
  DFrameBuffer *this_00;
  undefined8 uVar7;
  uint uVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dx;
  double *in_stack_00000040;
  byte in_stack_00000048;
  double dy;
  double local_c0;
  double h;
  double w;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  double dcb;
  double dcy;
  double dcx;
  double local_58;
  undefined8 uStack_50;
  double dcr;
  double tmp;
  
  this_00 = screen;
  if (texture == (FTexture *)0x0) {
    return;
  }
  local_90 = (double)((int)x >> 1);
  dy = (double)((int)y >> 1);
  uVar8 = ~offsetflags;
  if ((uVar8 & 0x42) == 0) {
    if (forceWidth < 0) {
      dVar12 = (texture->Scale).X;
      local_90 = (double)(int)texture->LeftOffset / dVar12 +
                 ((double)texture->Width / dVar12) * -0.5 + local_90;
    }
    else {
      dVar12 = (texture->Scale).X;
      local_90 = local_90 -
                 (0.5 - ((double)(int)texture->LeftOffset / dVar12) /
                        ((double)texture->Width / dVar12)) * (double)forceWidth;
    }
    if (dx._0_4_ < 0) {
      dVar12 = (texture->Scale).Y;
      dy = (double)(int)texture->TopOffset / dVar12 + ((double)texture->Height / dVar12) * -0.5 + dy
      ;
    }
    else {
      dVar12 = (texture->Scale).Y;
      dy = dy - (0.5 - ((double)(int)texture->TopOffset / dVar12) /
                       ((double)texture->Height / dVar12)) * (double)dx._0_4_;
    }
  }
  local_90 = (double)xOffset + local_90;
  dy = (double)yOffset + dy;
  if (!fullScreenOffsets) {
    tmp = 0.0;
    local_90 = local_90 + (double)*(int *)&(this->super_DBaseStatusBar).super_DObject.field_0x24;
    bVar2 = (this->super_DBaseStatusBar).Scaled;
    iVar5 = 200;
    if (bVar2 == true) {
      iVar5 = this->script->resH;
    }
    pSVar3 = this->script;
    dy = dy + (double)(((this->super_DBaseStatusBar).ST_Y - iVar5) + pSVar3->height);
    if (forceWidth < 0) {
      w = (double)texture->Width / (texture->Scale).X;
    }
    else {
      w = (double)forceWidth;
    }
    if (dx._0_4_ < 0) {
      h = (double)texture->Height / (texture->Scale).Y;
    }
    else {
      h = (double)dx._0_4_;
    }
    dVar12 = *in_stack_00000040;
    dcy = 0.0;
    dcx = 0.0;
    if ((dVar12 != 0.0) || (NAN(dVar12))) {
      dcx = (local_90 + dVar12) - (double)(int)texture->LeftOffset / (texture->Scale).X;
    }
    dVar13 = in_stack_00000040[1];
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      dcy = (dy + dVar13) - (double)(int)texture->TopOffset / (texture->Scale).Y;
    }
    dVar14 = in_stack_00000040[2];
    dcb = 2147483647.0;
    dcr = 2147483647.0;
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      dcr = ((local_90 + w) - dVar14) - (double)(int)texture->LeftOffset / (texture->Scale).X;
    }
    dVar14 = in_stack_00000040[3];
    if ((dVar14 != 0.0) || (NAN(dVar14))) {
      dcb = ((h + dy) - dVar14) - (double)(int)texture->TopOffset / (texture->Scale).Y;
    }
    if (bVar2 == false) {
      dVar12 = (double)(200 - pSVar3->resH);
      dy = dy + dVar12;
      dcy = dcy + dVar12;
      dcb = dcb + dVar12;
      local_c0 = Alpha;
    }
    else {
      if ((((dVar12 != 0.0) || (NAN(dVar12))) || (dVar13 != 0.0)) || (local_c0 = Alpha, NAN(dVar13))
         ) {
        local_c0 = Alpha;
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&dcx,&dcy,&tmp,&tmp,(double)pSVar3->resW,(double)pSVar3->resH,
                   true,true);
        if ((*in_stack_00000040 == 0.0) && (!NAN(*in_stack_00000040))) {
          dcx = 0.0;
        }
        if ((in_stack_00000040[1] == 0.0) && (!NAN(in_stack_00000040[1]))) {
          dcy = 0.0;
        }
      }
      if (((in_stack_00000040[2] != 0.0) || (NAN(in_stack_00000040[2]))) ||
         ((in_stack_00000040[3] == 0.0 & (in_stack_00000048 ^ 1)) == 0)) {
        DCanvas::VirtualToRealCoords
                  ((DCanvas *)screen,&dcr,&dcb,&tmp,&tmp,(double)this->script->resW,
                   (double)this->script->resH,true,true);
      }
      DCanvas::VirtualToRealCoords
                ((DCanvas *)screen,&local_90,&dy,&w,&h,(double)this->script->resW,
                 (double)this->script->resH,true,true);
    }
    this_00 = screen;
    uVar10 = SUB84(dy,0);
    uVar11 = (undefined4)((ulong)dy >> 0x20);
    if (in_stack_00000048 == 0) {
      uVar6 = (uint)dcx;
      local_78 = (ulong)(uint)(int)dcy;
      uVar15 = 0xffc00000;
      uVar16 = 0x41dfffff;
      if (dcr <= 2147483647.0) {
        uVar15 = SUB84(dcr,0);
        uVar16 = (undefined4)((ulong)dcr >> 0x20);
      }
      local_80 = (ulong)(uint)(int)(double)CONCAT44(uVar16,uVar15);
      dVar12 = 2147483647.0;
      if (dcb <= 2147483647.0) {
        dVar12 = dcb;
      }
      local_88 = (ulong)(uint)(int)dVar12;
      uVar9 = 0;
      dVar12 = local_90;
      if (!alphaMap) {
        if (translate) {
          local_58 = local_90;
          local_98 = w;
          local_a0 = dy;
          local_a8 = h;
          pFVar4 = GetTranslation(this);
          uVar10 = SUB84(local_a0,0);
          uVar11 = (undefined4)((ulong)local_a0 >> 0x20);
          dVar12 = local_58;
          dVar13 = local_98;
          dVar14 = local_a8;
        }
        else {
          pFVar4 = (FRemapTable *)0x0;
          dVar13 = w;
          dVar14 = h;
        }
        y_00 = (double)CONCAT44(uVar11,uVar10);
        uVar10 = SUB84(local_c0,0);
        if (dim) {
          uVar9 = 0xaa000000;
        }
        goto LAB_004c41a3;
      }
      if (translate) {
        local_58 = local_90;
        local_98 = w;
        local_a0 = dy;
        local_a8 = h;
        pFVar4 = GetTranslation(this);
        uVar10 = SUB84(local_a0,0);
        uVar11 = (undefined4)((ulong)local_a0 >> 0x20);
        dVar12 = local_58;
        dVar13 = local_98;
        dVar14 = local_a8;
      }
      else {
        pFVar4 = (FRemapTable *)0x0;
        dVar13 = w;
        dVar14 = h;
      }
      y_00 = (double)CONCAT44(uVar11,uVar10);
      uVar10 = SUB84(local_c0,0);
      uVar7 = 0xaa000000;
      if (!dim) {
        uVar7 = uVar9;
      }
      goto LAB_004c4105;
    }
    dVar13 = local_90;
    if (local_90 <= dcx) {
      dVar13 = dcx;
    }
    if (dy <= dcy) {
      uVar10 = SUB84(dcy,0);
      uVar11 = (undefined4)((ulong)dcy >> 0x20);
    }
    dVar14 = (double)CONCAT44(uVar11,uVar10);
    dVar17 = dcr;
    if (dVar13 + w <= dcr) {
      dVar17 = dVar13 + w;
    }
    dVar12 = (double)CONCAT44(uVar11,uVar10) + h;
    dVar18 = dcb;
    if (dVar12 <= dcb) {
      dVar18 = dVar12;
    }
    goto LAB_004c3f2e;
  }
  dVar19 = 1.0;
  dVar18 = 1.0;
  if (hud_scale.Value) {
    dVar18 = (double)this->script->cleanX;
    dVar19 = (double)this->script->cleanY;
  }
  dVar12 = local_90;
  if (((uint)x & 1) != 0) {
    if (hud_scale.Value) {
      dVar12 = dVar18 + dVar18;
    }
    else {
      dVar12 = 2.0;
    }
    dVar12 = local_90 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width / dVar12;
  }
  y_00 = dy;
  if (((uint)y & 1) != 0) {
    if (hud_scale.Value) {
      dVar13 = dVar19 + dVar19;
    }
    else {
      dVar13 = 2.0;
    }
    y_00 = dy + (double)(screen->super_DSimpleCanvas).super_DCanvas.Height / dVar13;
  }
  if (forceWidth < 0) {
    w = (double)texture->Width / (texture->Scale).X;
  }
  else {
    w = (double)forceWidth;
  }
  if (dx._0_4_ < 0) {
    h = (double)texture->Height / (texture->Scale).Y;
  }
  else {
    h = (double)dx._0_4_;
  }
  if (vid_fps.Value) {
    y_00 = (double)(~-(ulong)(dVar12 < 0.0) & (ulong)y_00 |
                   (~-(ulong)(0.0 <= y_00) & (ulong)y_00 |
                   (ulong)(y_00 + 10.0) & -(ulong)(0.0 <= y_00)) & -(ulong)(dVar12 < 0.0));
  }
  if (hud_scale.Value) {
    dVar12 = dVar12 * dVar18;
    y_00 = y_00 * dVar19;
    w = w * dVar18;
    h = h * dVar19;
  }
  if ((int)x >> 1 < 0 && ((uint)x & 1) == 0) {
    dVar12 = dVar12 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Width;
  }
  if ((int)y >> 1 < 0 && ((uint)y & 1) == 0) {
    y_00 = y_00 + (double)(screen->super_DSimpleCanvas).super_DCanvas.Height;
  }
  dVar17 = *in_stack_00000040;
  dVar13 = 0.0;
  if (((dVar17 != 0.0) || (NAN(dVar17))) ||
     ((in_stack_00000040[1] != 0.0 || (NAN(in_stack_00000040[1]))))) {
LAB_004c3e1c:
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      dVar13 = (dVar17 - (double)(int)texture->LeftOffset / (texture->Scale).X) * dVar18 + dVar12;
    }
    dVar17 = in_stack_00000040[1];
    dVar14 = 0.0;
    if ((dVar17 != 0.0) || (NAN(dVar17))) {
      dVar14 = (dVar17 - (double)(int)texture->TopOffset / (texture->Scale).Y) * dVar19 + y_00;
    }
    dVar1 = in_stack_00000040[2];
    dVar17 = 2147483647.0;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      dVar17 = (w + dVar12) -
               dVar18 * (dVar1 + (double)(int)texture->LeftOffset / (texture->Scale).X);
    }
    dVar1 = in_stack_00000040[3];
    if ((dVar1 != 0.0) || (dVar18 = 2147483647.0, NAN(dVar1))) {
      dVar18 = (h + y_00) - dVar19 * (dVar1 + (double)(int)texture->TopOffset / (texture->Scale).Y);
    }
  }
  else {
    dVar14 = 0.0;
    if (((in_stack_00000040[2] != 0.0) || (NAN(in_stack_00000040[2]))) ||
       ((in_stack_00000040[3] != 0.0 || (NAN(in_stack_00000040[3]))))) goto LAB_004c3e1c;
    dVar17 = 2147483647.0;
    dVar18 = dVar17;
  }
  if (in_stack_00000048 == 0) {
    uVar6 = (uint)dVar13;
    local_78 = (ulong)(uint)(int)dVar14;
    local_80 = (ulong)(uint)(int)dVar17;
    local_88 = (ulong)(uint)(int)dVar18;
    uVar9 = 0;
    if (!alphaMap) {
      if (translate) {
        uStack_50 = 0;
        local_a0 = w;
        local_a8 = h;
        local_c0 = Alpha;
        local_98 = dVar12;
        local_58 = y_00;
        pFVar4 = GetTranslation(this);
        dVar12 = local_98;
        dVar13 = local_a0;
        dVar14 = local_a8;
        Alpha = local_c0;
        y_00 = local_58;
      }
      else {
        pFVar4 = (FRemapTable *)0x0;
        dVar13 = w;
        dVar14 = h;
      }
      if (dim) {
        uVar9 = 0xaa000000;
      }
      uVar10 = SUB84(Alpha,0);
LAB_004c41a3:
      DCanvas::DrawTexture
                ((DCanvas *)this_00,texture,dVar12,y_00,0x400013af,dVar13,dVar14,uVar10,0x400013b0,
                 0x400013a3,(ulong)uVar6,0x400013a1,local_78,0x400013a4,local_80,0x400013a2,local_88
                 ,0x4000138e,pFVar4,0x400013aa,uVar9,0x4000139e,(ulong)((uVar8 & 0x44) == 0),
                 0x4000138c,0);
      return;
    }
    if (translate) {
      uStack_50 = 0;
      local_a0 = w;
      local_a8 = h;
      local_c0 = Alpha;
      local_98 = dVar12;
      local_58 = y_00;
      pFVar4 = GetTranslation(this);
      dVar12 = local_98;
      dVar13 = local_a0;
      dVar14 = local_a8;
      Alpha = local_c0;
      y_00 = local_58;
    }
    else {
      pFVar4 = (FRemapTable *)0x0;
      dVar13 = w;
      dVar14 = h;
    }
    uVar7 = 0xaa000000;
    if (!dim) {
      uVar7 = uVar9;
    }
    uVar10 = SUB84(Alpha,0);
LAB_004c4105:
    DCanvas::DrawTexture
              ((DCanvas *)this_00,texture,dVar12,y_00,0x400013af,dVar13,dVar14,uVar10,0x400013b0,
               0x400013a3,(ulong)uVar6,0x400013a1,local_78,0x400013a4,local_80,0x400013a2,local_88,
               0x4000138e,pFVar4,0x400013aa,uVar7,0x4000139e,(ulong)((uVar8 & 0x44) == 0),0x4000138c
               ,0x4000138f,1,0x4000138d,0,0);
    return;
  }
  if (dVar13 + w <= dVar17) {
    dVar17 = dVar13 + w;
  }
  if (dVar14 + h <= dVar18) {
    dVar18 = dVar14 + h;
  }
LAB_004c3f2e:
  (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x13])
            (screen,(ulong)(uint)(int)dVar13,(ulong)(uint)(int)dVar14,(ulong)(uint)(int)dVar17,
             (ulong)(uint)(int)dVar18,(ulong)GPalette.BlackIndex,0);
  return;
}

Assistant:

void DrawGraphic(FTexture* texture, SBarInfoCoordinate x, SBarInfoCoordinate y, int xOffset, int yOffset, double Alpha, bool fullScreenOffsets, bool translate=false, bool dim=false, int offsetflags=0, bool alphaMap=false, int forceWidth=-1, int forceHeight=-1, const double *clip = nulclip, bool clearDontDraw=false) const
	{
		if (texture == NULL)
			return;

		double dx = *x;
		double dy = *y;

		if((offsetflags & SBarInfoCommand::CENTER) == SBarInfoCommand::CENTER)
		{
			if (forceWidth < 0)	dx -= (texture->GetScaledWidthDouble()/2.0)-texture->GetScaledLeftOffsetDouble();
			else	dx -= forceWidth*(0.5-(texture->GetScaledLeftOffsetDouble()/texture->GetScaledWidthDouble()));
			//Unoptimalized formula is dx -= forceWidth/2.0-(texture->GetScaledLeftOffsetDouble()*forceWidth/texture->GetScaledWidthDouble());
			
			if (forceHeight < 0)	dy -= (texture->GetScaledHeightDouble()/2.0)-texture->GetScaledTopOffsetDouble();
			else	dy -= forceHeight*(0.5-(texture->GetScaledTopOffsetDouble()/texture->GetScaledHeightDouble()));
		}

		dx += xOffset;
		dy += yOffset;
		double w, h;
		if(!fullScreenOffsets)
		{
			double tmp = 0;
			dx += ST_X;
			dy += ST_Y - (Scaled ? script->resH : 200) + script->height;
			w = forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth;
			h = forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight;
			double dcx = clip[0] == 0 ? 0 : dx + clip[0] - texture->GetScaledLeftOffsetDouble();
			double dcy = clip[1] == 0 ? 0 : dy + clip[1] - texture->GetScaledTopOffsetDouble();
			double dcr = clip[2] == 0 ? INT_MAX : dx + w - clip[2] - texture->GetScaledLeftOffsetDouble();
			double dcb = clip[3] == 0 ? INT_MAX : dy + h - clip[3] - texture->GetScaledTopOffsetDouble();

			if(Scaled)
			{
				if(clip[0] != 0 || clip[1] != 0)
				{
					screen->VirtualToRealCoords(dcx, dcy, tmp, tmp, script->resW, script->resH, true);
					if (clip[0] == 0) dcx = 0;
					if (clip[1] == 0) dcy = 0;
				}
				if(clip[2] != 0 || clip[3] != 0 || clearDontDraw)
					screen->VirtualToRealCoords(dcr, dcb, tmp, tmp, script->resW, script->resH, true);
				screen->VirtualToRealCoords(dx, dy, w, h, script->resW, script->resH, true);
			}
			else
			{
				dy += 200 - script->resH;
				dcy += 200 - script->resH;
				dcb += 200 - script->resH;
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(MAX<double>(dx, dcx)), static_cast<int>(MAX<double>(dy, dcy)), static_cast<int>(MIN<double>(dcr,w+MAX<double>(dx, dcx))), static_cast<int>(MIN<double>(dcb,MAX<double>(dy, dcy)+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, dx, dy,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(dcx),
						DTA_ClipTop, static_cast<int>(dcy),
						DTA_ClipRight, static_cast<int>(MIN<double>(INT_MAX, dcr)),
						DTA_ClipBottom, static_cast<int>(MIN<double>(INT_MAX, dcb)),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
		else
		{
			double rx, ry, rcx=0, rcy=0, rcr=INT_MAX, rcb=INT_MAX;

			double xScale = !hud_scale ? 1 : script->cleanX;
			double yScale = !hud_scale ? 1 : script->cleanY;

			adjustRelCenter(x.RelCenter(), y.RelCenter(), dx, dy, rx, ry, xScale, yScale);

			// We can't use DTA_HUDRules since it forces a width and height.
			// Translation: No high res.
			bool xright = *x < 0 && !x.RelCenter();
			bool ybot = *y < 0 && !y.RelCenter();

			w = (forceWidth < 0 ? texture->GetScaledWidthDouble() : forceWidth);
			h = (forceHeight < 0 ? texture->GetScaledHeightDouble() : forceHeight);
			if(vid_fps && rx < 0 && ry >= 0)
				ry += 10;
			if(hud_scale)
			{
				rx *= xScale;
				ry *= yScale;
				w *= xScale;
				h *= yScale;
			}
			if(xright)
				rx = SCREENWIDTH + rx;
			if(ybot)
				ry = SCREENHEIGHT + ry;

			// Check for clipping
			if(clip[0] != 0 || clip[1] != 0 || clip[2] != 0 || clip[3] != 0)
			{
				rcx = clip[0] == 0 ? 0 : rx+((clip[0] - texture->GetScaledLeftOffsetDouble())*xScale);
				rcy = clip[1] == 0 ? 0 : ry+((clip[1] - texture->GetScaledTopOffsetDouble())*yScale);
				rcr = clip[2] == 0 ? INT_MAX : rx+w-((clip[2] + texture->GetScaledLeftOffsetDouble())*xScale);
				rcb = clip[3] == 0 ? INT_MAX : ry+h-((clip[3] + texture->GetScaledTopOffsetDouble())*yScale);
			}

			if(clearDontDraw)
				screen->Clear(static_cast<int>(rcx), static_cast<int>(rcy), static_cast<int>(MIN<double>(rcr, rcx+w)), static_cast<int>(MIN<double>(rcb, rcy+h)), GPalette.BlackIndex, 0);
			else
			{
				if(alphaMap)
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						DTA_AlphaChannel, alphaMap,
						DTA_FillColor, 0,
						TAG_DONE);
				}
				else
				{
					screen->DrawTexture(texture, rx, ry,
						DTA_DestWidthF, w,
						DTA_DestHeightF, h,
						DTA_ClipLeft, static_cast<int>(rcx),
						DTA_ClipTop, static_cast<int>(rcy),
						DTA_ClipRight, static_cast<int>(rcr),
						DTA_ClipBottom, static_cast<int>(rcb),
						DTA_Translation, translate ? GetTranslation() : 0,
						DTA_ColorOverlay, dim ? DIM_OVERLAY : 0,
						DTA_CenterBottomOffset, (offsetflags & SBarInfoCommand::CENTER_BOTTOM) == SBarInfoCommand::CENTER_BOTTOM,
						DTA_AlphaF, Alpha,
						TAG_DONE);
				}
			}
		}
	}